

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O1

ssl_open_record_t
bssl::dtls1_open_change_cipher_spec
          (SSL *ssl,size_t *out_consumed,uint8_t *out_alert,Span<unsigned_char> in)

{
  ushort uVar1;
  ssl_open_record_t sVar2;
  size_t in_R9;
  bool bVar3;
  Span<unsigned_char> in_00;
  
  in_00.data_ = (uchar *)in.size_;
  if (((undefined1  [1016])((undefined1  [1016])*ssl->d1 & (undefined1  [1016])0x1) ==
       (undefined1  [1016])0x0) &&
     (in_00.size_ = in_R9,
     sVar2 = dtls1_open_handshake
                       ((bssl *)ssl,(SSL *)out_consumed,(size_t *)out_alert,in.data_,in_00),
     sVar2 != ssl_open_record_success)) {
    return sVar2;
  }
  uVar1 = *(ushort *)ssl->d1;
  bVar3 = (uVar1 & 1) != 0;
  if (bVar3) {
    *(ushort *)ssl->d1 = uVar1 & 0xfffe;
  }
  return (uint)!bVar3;
}

Assistant:

ssl_open_record_t dtls1_open_change_cipher_spec(SSL *ssl, size_t *out_consumed,
                                                uint8_t *out_alert,
                                                Span<uint8_t> in) {
  if (!ssl->d1->has_change_cipher_spec) {
    // dtls1_open_handshake processes both handshake and ChangeCipherSpec.
    auto ret = dtls1_open_handshake(ssl, out_consumed, out_alert, in);
    if (ret != ssl_open_record_success) {
      return ret;
    }
  }
  if (ssl->d1->has_change_cipher_spec) {
    ssl->d1->has_change_cipher_spec = false;
    return ssl_open_record_success;
  }
  return ssl_open_record_discard;
}